

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idna.c
# Opt level: O1

int run_test_utf8_decode1_overrun(void)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uv_loop_t *puVar4;
  undefined8 uVar5;
  uv_buf_t *extraout_RDX;
  char *in_R10;
  uv_buf_t uVar6;
  undefined8 uStack_260;
  char *pcStack_258;
  ssize_t sStack_250;
  undefined8 uStack_248;
  char acStack_240 [256];
  long alStack_140 [28];
  undefined8 uStack_60;
  char *pcStack_58;
  char *pcStack_50;
  char *pcStack_48;
  code *apcStack_40 [2];
  char b [1];
  char c [1];
  int64_t eval_b;
  int64_t eval_a;
  char *p;
  
  b[0] = '\x7f';
  eval_a = 0x7f;
  apcStack_40[0] = (code *)0x19db0c;
  p = b;
  uVar1 = uv__utf8_decode1(&p,c);
  eval_b = (int64_t)uVar1;
  if (eval_a == eval_b) {
    in_R10 = p;
    if (p == c) {
      b[0] = -0x40;
      eval_a = 0xffffffff;
      apcStack_40[0] = (code *)0x19db50;
      p = b;
      uVar1 = uv__utf8_decode1(&p,c);
      eval_b = (int64_t)uVar1;
      if (eval_a == eval_b) {
        in_R10 = p;
        if (p == c) {
          b[0] = '\x7f';
          eval_b = -0x16;
          eval_a = -0x16;
          apcStack_40[0] = (code *)0x19dbbb;
          eval_b = uv__idna_toascii(b,c,c,(char *)&eval_b);
          if (eval_a == eval_b) {
            return 0;
          }
          apcStack_40[0] = run_test_idna_toascii;
          run_test_utf8_decode1_overrun_cold_4();
          pcStack_258 = (char *)0x19dcaf;
          apcStack_40[0] = (code *)c;
          memset(acStack_240,0,0x100);
          alStack_140[0] = -0x16;
          pcStack_258 = (char *)0x19dcd9;
          sStack_250 = uv__idna_toascii(anon_var_dwarf_4d1c8,anon_var_dwarf_4d1c8 + 4,acStack_240,
                                        (char *)alStack_140);
          if (alStack_140[0] == sStack_250) {
            pcStack_258 = (char *)0x19dd03;
            memset(acStack_240,0,0x100);
            alStack_140[0] = -0x16;
            pcStack_258 = (char *)0x19dd2d;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_1,run_test_idna_toascii::s_1 + 8,
                                          acStack_240,(char *)alStack_140);
            if (alStack_140[0] != sStack_250) goto LAB_001a198e;
            acStack_240[0] = -0x16;
            acStack_240[1] = -1;
            acStack_240[2] = -1;
            acStack_240[3] = -1;
            acStack_240[4] = -1;
            acStack_240[5] = -1;
            acStack_240[6] = -1;
            acStack_240[7] = -1;
            alStack_140[0] = -0x16;
            pcStack_258 = (char *)0x19dd7e;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19dd92;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19ddb0;
            sStack_250 = uv__idna_toascii(".","",acStack_240,(char *)alStack_140);
            uStack_248 = 2;
            if (sStack_250 != 2) goto LAB_001a19b0;
            pcStack_258 = (char *)0x19dde0;
            iVar2 = memcmp(acStack_240,".",2);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a19bd;
            pcStack_258 = (char *)0x19de0b;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19de2b;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 2;
            if (sStack_250 != 2) goto LAB_001a19ca;
            pcStack_258 = (char *)0x19de5e;
            iVar2 = memcmp(alStack_140,".",2);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a19d7;
            pcStack_258 = (char *)0x19de93;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a19e4;
            pcStack_258 = (char *)0x19dec5;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19ded9;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19def7;
            sStack_250 = uv__idna_toascii(".com","",acStack_240,(char *)alStack_140);
            uStack_248 = 5;
            if (sStack_250 != 5) goto LAB_001a19f1;
            pcStack_258 = (char *)0x19df27;
            iVar2 = memcmp(acStack_240,".com",5);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a19fe;
            pcStack_258 = (char *)0x19df52;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19df72;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 5;
            if (sStack_250 != 5) goto LAB_001a1a0b;
            pcStack_258 = (char *)0x19dfa5;
            iVar2 = memcmp(alStack_140,".com",5);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1a18;
            pcStack_258 = (char *)0x19dfda;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1a25;
            pcStack_258 = (char *)0x19e00c;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19e020;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19e03e;
            sStack_250 = uv__idna_toascii("example","",acStack_240,(char *)alStack_140);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a1a32;
            pcStack_258 = (char *)0x19e06e;
            iVar2 = memcmp(acStack_240,"example",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1a3f;
            pcStack_258 = (char *)0x19e099;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19e0b9;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a1a4c;
            pcStack_258 = (char *)0x19e0ec;
            iVar2 = memcmp(alStack_140,"example",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1a59;
            pcStack_258 = (char *)0x19e121;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1a66;
            pcStack_258 = (char *)0x19e153;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19e167;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19e185;
            sStack_250 = uv__idna_toascii("example-","",acStack_240,(char *)alStack_140);
            uStack_248 = 9;
            if (sStack_250 != 9) goto LAB_001a1a73;
            pcStack_258 = (char *)0x19e1b5;
            iVar2 = memcmp(acStack_240,"example-",9);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1a80;
            pcStack_258 = (char *)0x19e1e0;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19e200;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 9;
            if (sStack_250 != 9) goto LAB_001a1a8d;
            pcStack_258 = (char *)0x19e233;
            iVar2 = memcmp(alStack_140,"example-",9);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1a9a;
            pcStack_258 = (char *)0x19e268;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1aa7;
            pcStack_258 = (char *)0x19e29a;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19e2ae;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19e2cc;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_6,run_test_idna_toascii::s_6 + 10
                                          ,acStack_240,(char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a1ab4;
            pcStack_258 = (char *)0x19e2fc;
            iVar2 = memcmp(acStack_240,"xn--strae-oqa.de",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1ac1;
            pcStack_258 = (char *)0x19e327;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19e347;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a1ace;
            pcStack_258 = (char *)0x19e37a;
            iVar2 = memcmp(alStack_140,"xn--strae-oqa.de",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1adb;
            pcStack_258 = (char *)0x19e3af;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1ae8;
            pcStack_258 = (char *)0x19e3e1;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19e3f5;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19e413;
            sStack_250 = uv__idna_toascii("foo.bar","",acStack_240,(char *)alStack_140);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a1af5;
            pcStack_258 = (char *)0x19e443;
            iVar2 = memcmp(acStack_240,"foo.bar",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1b02;
            pcStack_258 = (char *)0x19e46e;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19e48e;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a1b0f;
            pcStack_258 = (char *)0x19e4c1;
            iVar2 = memcmp(alStack_140,"foo.bar",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1b1c;
            pcStack_258 = (char *)0x19e4f6;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1b29;
            pcStack_258 = (char *)0x19e528;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19e53c;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19e55a;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_8,
                                          run_test_idna_toascii::s_8 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1b36;
            pcStack_258 = (char *)0x19e58a;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1b43;
            pcStack_258 = (char *)0x19e5b5;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19e5d5;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1b50;
            pcStack_258 = (char *)0x19e608;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1b5d;
            pcStack_258 = (char *)0x19e63d;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1b6a;
            pcStack_258 = (char *)0x19e66f;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19e683;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19e6a1;
            sStack_250 = uv__idna_toascii("example.com.","",acStack_240,(char *)alStack_140);
            uStack_248 = 0xd;
            if (sStack_250 != 0xd) goto LAB_001a1b77;
            pcStack_258 = (char *)0x19e6d1;
            iVar2 = memcmp(acStack_240,"example.com.",0xd);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1b84;
            pcStack_258 = (char *)0x19e6fc;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19e71c;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0xd;
            if (sStack_250 != 0xd) goto LAB_001a1b91;
            pcStack_258 = (char *)0x19e74f;
            iVar2 = memcmp(alStack_140,"example.com.",0xd);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1b9e;
            pcStack_258 = (char *)0x19e784;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1bab;
            pcStack_258 = (char *)0x19e7b6;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19e7ca;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19e7e8;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_10,
                                          run_test_idna_toascii::s_10 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1bb8;
            pcStack_258 = (char *)0x19e818;
            iVar2 = memcmp(acStack_240,"xn--bcher-kva.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1bc5;
            pcStack_258 = (char *)0x19e843;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19e863;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1bd2;
            pcStack_258 = (char *)0x19e896;
            iVar2 = memcmp(alStack_140,"xn--bcher-kva.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1bdf;
            pcStack_258 = (char *)0x19e8cb;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1bec;
            pcStack_258 = (char *)0x19e8fd;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19e911;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19e92f;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_11,
                                          run_test_idna_toascii::s_11 + 9,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x10;
            if (sStack_250 != 0x10) goto LAB_001a1bf9;
            pcStack_258 = (char *)0x19e95f;
            iVar2 = memcmp(acStack_240,"xn--caf-dma.com",0x10);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1c06;
            pcStack_258 = (char *)0x19e98a;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19e9aa;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x10;
            if (sStack_250 != 0x10) goto LAB_001a1c13;
            pcStack_258 = (char *)0x19e9dd;
            iVar2 = memcmp(alStack_140,"xn--caf-dma.com",0x10);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1c20;
            pcStack_258 = (char *)0x19ea12;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1c2d;
            pcStack_258 = (char *)0x19ea44;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19ea58;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19ea76;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_12,
                                          run_test_idna_toascii::s_12 + 0xf,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1c;
            if (sStack_250 != 0x1c) goto LAB_001a1c3a;
            pcStack_258 = (char *)0x19eaa6;
            iVar2 = memcmp(acStack_240,"xn--caf-dma.xn--caf-dma.com",0x1c);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1c47;
            pcStack_258 = (char *)0x19ead1;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19eaf1;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1c;
            if (sStack_250 != 0x1c) goto LAB_001a1c54;
            pcStack_258 = (char *)0x19eb24;
            iVar2 = memcmp(alStack_140,"xn--caf-dma.xn--caf-dma.com",0x1c);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1c61;
            pcStack_258 = (char *)0x19eb59;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1c6e;
            pcStack_258 = (char *)0x19eb8b;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19eb9f;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19ebbd;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_13,
                                          run_test_idna_toascii::s_13 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a1c7b;
            pcStack_258 = (char *)0x19ebed;
            iVar2 = memcmp(acStack_240,"xn----dqo34k.com",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1c88;
            pcStack_258 = (char *)0x19ec18;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19ec38;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a1c95;
            pcStack_258 = (char *)0x19ec6b;
            iVar2 = memcmp(alStack_140,"xn----dqo34k.com",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1ca2;
            pcStack_258 = (char *)0x19eca0;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1caf;
            pcStack_258 = (char *)0x19ecd2;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19ece6;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19ed04;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_14,
                                          run_test_idna_toascii::s_14 + 0xe,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x15;
            if (sStack_250 != 0x15) goto LAB_001a1cbc;
            pcStack_258 = (char *)0x19ed34;
            iVar2 = memcmp(acStack_240,"xn----dqo34kn65z.com",0x15);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1cc9;
            pcStack_258 = (char *)0x19ed5f;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19ed7f;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x15;
            if (sStack_250 != 0x15) goto LAB_001a1cd6;
            pcStack_258 = (char *)0x19edb2;
            iVar2 = memcmp(alStack_140,"xn----dqo34kn65z.com",0x15);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1ce3;
            pcStack_258 = (char *)0x19ede7;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1cf0;
            pcStack_258 = (char *)0x19ee19;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19ee2d;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19ee4b;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_15,
                                          run_test_idna_toascii::s_15 + 7,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0xc;
            if (sStack_250 != 0xc) goto LAB_001a1cfd;
            pcStack_258 = (char *)0x19ee7b;
            iVar2 = memcmp(acStack_240,"xn--ls8h.la",0xc);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1d0a;
            pcStack_258 = (char *)0x19eea6;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19eec6;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0xc;
            if (sStack_250 != 0xc) goto LAB_001a1d17;
            pcStack_258 = (char *)0x19eef9;
            iVar2 = memcmp(alStack_140,"xn--ls8h.la",0xc);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1d24;
            pcStack_258 = (char *)0x19ef2e;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1d31;
            pcStack_258 = (char *)0x19ef60;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19ef74;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19ef92;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_16,
                                          run_test_idna_toascii::s_16 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1d3e;
            pcStack_258 = (char *)0x19efc2;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1d4b;
            pcStack_258 = (char *)0x19efed;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19f00d;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1d58;
            pcStack_258 = (char *)0x19f040;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1d65;
            pcStack_258 = (char *)0x19f075;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1d72;
            pcStack_258 = (char *)0x19f0a7;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19f0bb;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19f0d9;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_17,
                                          run_test_idna_toascii::s_17 + 0xd,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1d7f;
            pcStack_258 = (char *)0x19f109;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1d8c;
            pcStack_258 = (char *)0x19f134;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19f154;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1d99;
            pcStack_258 = (char *)0x19f187;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1da6;
            pcStack_258 = (char *)0x19f1bc;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1db3;
            pcStack_258 = (char *)0x19f1ee;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19f202;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19f220;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_18,
                                          run_test_idna_toascii::s_18 + 0xd,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1dc0;
            pcStack_258 = (char *)0x19f250;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1dcd;
            pcStack_258 = (char *)0x19f27b;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19f29b;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1dda;
            pcStack_258 = (char *)0x19f2ce;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1de7;
            pcStack_258 = (char *)0x19f303;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1df4;
            pcStack_258 = (char *)0x19f335;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19f349;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19f367;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_19,
                                          run_test_idna_toascii::s_19 + 0xd,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1e01;
            pcStack_258 = (char *)0x19f397;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1e0e;
            pcStack_258 = (char *)0x19f3c2;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19f3e2;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a1e1b;
            pcStack_258 = (char *)0x19f415;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1e28;
            pcStack_258 = (char *)0x19f44a;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1e35;
            pcStack_258 = (char *)0x19f47c;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19f490;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19f4ae;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_20,
                                          run_test_idna_toascii::s_20 + 2,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a1e42;
            pcStack_258 = (char *)0x19f4de;
            iVar2 = memcmp(acStack_240,"xn--tda",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1e4f;
            pcStack_258 = (char *)0x19f509;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19f529;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a1e5c;
            pcStack_258 = (char *)0x19f55c;
            iVar2 = memcmp(alStack_140,"xn--tda",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1e69;
            pcStack_258 = (char *)0x19f591;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1e76;
            pcStack_258 = (char *)0x19f5c3;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19f5d7;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19f5f5;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_21,
                                          run_test_idna_toascii::s_21 + 3,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 9;
            if (sStack_250 != 9) goto LAB_001a1e83;
            pcStack_258 = (char *)0x19f625;
            iVar2 = memcmp(acStack_240,".xn--tda",9);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1e90;
            pcStack_258 = (char *)0x19f650;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19f670;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 9;
            if (sStack_250 != 9) goto LAB_001a1e9d;
            pcStack_258 = (char *)0x19f6a3;
            iVar2 = memcmp(alStack_140,".xn--tda",9);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1eaa;
            pcStack_258 = (char *)0x19f6d8;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1eb7;
            pcStack_258 = (char *)0x19f70a;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19f71e;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19f73c;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_22,
                                          run_test_idna_toascii::s_22 + 5,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x10;
            if (sStack_250 != 0x10) goto LAB_001a1ec4;
            pcStack_258 = (char *)0x19f76c;
            iVar2 = memcmp(acStack_240,"xn--tda.xn--tda",0x10);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1ed1;
            pcStack_258 = (char *)0x19f797;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19f7b7;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x10;
            if (sStack_250 != 0x10) goto LAB_001a1ede;
            pcStack_258 = (char *)0x19f7ea;
            iVar2 = memcmp(alStack_140,"xn--tda.xn--tda",0x10);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1eeb;
            pcStack_258 = (char *)0x19f81f;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1ef8;
            pcStack_258 = (char *)0x19f851;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19f865;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19f883;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_23,
                                          run_test_idna_toascii::s_23 + 6,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a1f05;
            pcStack_258 = (char *)0x19f8b3;
            iVar2 = memcmp(acStack_240,"xn--tda.xn--tda.",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1f12;
            pcStack_258 = (char *)0x19f8de;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19f8fe;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a1f1f;
            pcStack_258 = (char *)0x19f931;
            iVar2 = memcmp(alStack_140,"xn--tda.xn--tda.",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1f2c;
            pcStack_258 = (char *)0x19f966;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1f39;
            pcStack_258 = (char *)0x19f998;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19f9ac;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19f9ca;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_24,
                                          run_test_idna_toascii::s_24 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a1f46;
            pcStack_258 = (char *)0x19f9fa;
            iVar2 = memcmp(acStack_240,"xn--4can8av2009b",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1f53;
            pcStack_258 = (char *)0x19fa25;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19fa45;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a1f60;
            pcStack_258 = (char *)0x19fa78;
            iVar2 = memcmp(alStack_140,"xn--4can8av2009b",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1f6d;
            pcStack_258 = (char *)0x19faad;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1f7a;
            pcStack_258 = (char *)0x19fadf;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19faf3;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19fb11;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_25,
                                          run_test_idna_toascii::s_25 + 0x44,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x4b;
            if (sStack_250 != 0x4b) goto LAB_001a1f87;
            pcStack_258 = (char *)0x19fb41;
            iVar2 = memcmp(acStack_240,
                           "xn--Willst du die Blthe des frhen, die Frchte des spteren Jahres-x9e96lkal"
                           ,0x4b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1f94;
            pcStack_258 = (char *)0x19fb6c;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19fb8c;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x4b;
            if (sStack_250 != 0x4b) goto LAB_001a1fa1;
            pcStack_258 = (char *)0x19fbbf;
            iVar2 = memcmp(alStack_140,
                           "xn--Willst du die Blthe des frhen, die Frchte des spteren Jahres-x9e96lkal"
                           ,0x4b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1fae;
            pcStack_258 = (char *)0x19fbf4;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1fbb;
            pcStack_258 = (char *)0x19fc26;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19fc3a;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19fc58;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_26,
                                          run_test_idna_toascii::s_26 + 0x22,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1b;
            if (sStack_250 != 0x1b) goto LAB_001a1fc8;
            pcStack_258 = (char *)0x19fc88;
            iVar2 = memcmp(acStack_240,"xn--egbpdaj6bu4bxfgehfvwxn",0x1b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1fd5;
            pcStack_258 = (char *)0x19fcb3;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19fcd3;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1b;
            if (sStack_250 != 0x1b) goto LAB_001a1fe2;
            pcStack_258 = (char *)0x19fd06;
            iVar2 = memcmp(alStack_140,"xn--egbpdaj6bu4bxfgehfvwxn",0x1b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1fef;
            pcStack_258 = (char *)0x19fd3b;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a1ffc;
            pcStack_258 = (char *)0x19fd6d;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19fd81;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19fd9f;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_27,
                                          run_test_idna_toascii::s_27 + 0x1b,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1d;
            if (sStack_250 != 0x1d) goto LAB_001a2009;
            pcStack_258 = (char *)0x19fdcf;
            iVar2 = memcmp(acStack_240,"xn--ihqwcrb4cv8a8dqg056pqjye",0x1d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2016;
            pcStack_258 = (char *)0x19fdfa;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19fe1a;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1d;
            if (sStack_250 != 0x1d) goto LAB_001a2023;
            pcStack_258 = (char *)0x19fe4d;
            iVar2 = memcmp(alStack_140,"xn--ihqwcrb4cv8a8dqg056pqjye",0x1d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2030;
            pcStack_258 = (char *)0x19fe82;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a203d;
            pcStack_258 = (char *)0x19feb4;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x19fec8;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x19fee6;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_28,
                                          run_test_idna_toascii::s_28 + 0x1b,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x20;
            if (sStack_250 != 0x20) goto LAB_001a204a;
            pcStack_258 = (char *)0x19ff16;
            iVar2 = memcmp(acStack_240,"xn--ihqwctvzc91f659drss3x8bo0yb",0x20);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2057;
            pcStack_258 = (char *)0x19ff41;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x19ff61;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x20;
            if (sStack_250 != 0x20) goto LAB_001a2064;
            pcStack_258 = (char *)0x19ff94;
            iVar2 = memcmp(alStack_140,"xn--ihqwctvzc91f659drss3x8bo0yb",0x20);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2071;
            pcStack_258 = (char *)0x19ffc9;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a207e;
            pcStack_258 = (char *)0x19fffb;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a000f;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a002d;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_29,
                                          run_test_idna_toascii::s_29 + 0x1a,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x23;
            if (sStack_250 != 0x23) goto LAB_001a208b;
            pcStack_258 = (char *)0x1a005d;
            iVar2 = memcmp(acStack_240,"xn--Proprostnemluvesky-uyb24dma41a",0x23);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2098;
            pcStack_258 = (char *)0x1a0088;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a00a8;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x23;
            if (sStack_250 != 0x23) goto LAB_001a20a5;
            pcStack_258 = (char *)0x1a00db;
            iVar2 = memcmp(alStack_140,"xn--Proprostnemluvesky-uyb24dma41a",0x23);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a20b2;
            pcStack_258 = (char *)0x1a0110;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a20bf;
            pcStack_258 = (char *)0x1a0142;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a0156;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a0174;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_30,
                                          run_test_idna_toascii::s_30 + 0x2c,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x21;
            if (sStack_250 != 0x21) goto LAB_001a20cc;
            pcStack_258 = (char *)0x1a01a4;
            iVar2 = memcmp(acStack_240,"xn--4dbcagdahymbxekheh6e0a7fei0b",0x21);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a20d9;
            pcStack_258 = (char *)0x1a01cf;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a01ef;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x21;
            if (sStack_250 != 0x21) goto LAB_001a20e6;
            pcStack_258 = (char *)0x1a0222;
            iVar2 = memcmp(alStack_140,"xn--4dbcagdahymbxekheh6e0a7fei0b",0x21);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a20f3;
            pcStack_258 = (char *)0x1a0257;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2100;
            pcStack_258 = (char *)0x1a0289;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a029d;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a02bb;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_31,
                                          run_test_idna_toascii::s_31 + 0x5a,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x31;
            if (sStack_250 != 0x31) goto LAB_001a210d;
            pcStack_258 = (char *)0x1a02eb;
            iVar2 = memcmp(acStack_240,"xn--i1baa7eci9glrd9b2ae1bj0hfcgg6iyaf8o0a1dig0cd",0x31);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a211a;
            pcStack_258 = (char *)0x1a0316;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a0336;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x31;
            if (sStack_250 != 0x31) goto LAB_001a2127;
            pcStack_258 = (char *)0x1a0369;
            iVar2 = memcmp(alStack_140,"xn--i1baa7eci9glrd9b2ae1bj0hfcgg6iyaf8o0a1dig0cd",0x31);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2134;
            pcStack_258 = (char *)0x1a039e;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2141;
            pcStack_258 = (char *)0x1a03d0;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a03e4;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a0402;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_32,
                                          run_test_idna_toascii::s_32 + 0x36,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x2b;
            if (sStack_250 != 0x2b) goto LAB_001a214e;
            pcStack_258 = (char *)0x1a0432;
            iVar2 = memcmp(acStack_240,"xn--n8jok5ay5dzabd5bym9f0cm5685rrjetr6pdxa",0x2b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a215b;
            pcStack_258 = (char *)0x1a045d;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a047d;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x2b;
            if (sStack_250 != 0x2b) goto LAB_001a2168;
            pcStack_258 = (char *)0x1a04b0;
            iVar2 = memcmp(alStack_140,"xn--n8jok5ay5dzabd5bym9f0cm5685rrjetr6pdxa",0x2b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2175;
            pcStack_258 = (char *)0x1a04e5;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2182;
            pcStack_258 = (char *)0x1a0517;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a052b;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a0549;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_33,
                                          run_test_idna_toascii::s_33 + 0x48,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x4a;
            if (sStack_250 != 0x4a) goto LAB_001a218f;
            pcStack_258 = (char *)0x1a0579;
            iVar2 = memcmp(acStack_240,
                           "xn--989aomsvi5e83db1d2a355cv1e0vak1dwrv93d5xbh15a0dt30a5jpsd879ccm6fea98c"
                           ,0x4a);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a219c;
            pcStack_258 = (char *)0x1a05a4;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a05c4;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x4a;
            if (sStack_250 != 0x4a) goto LAB_001a21a9;
            pcStack_258 = (char *)0x1a05f7;
            iVar2 = memcmp(alStack_140,
                           "xn--989aomsvi5e83db1d2a355cv1e0vak1dwrv93d5xbh15a0dt30a5jpsd879ccm6fea98c"
                           ,0x4a);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a21b6;
            pcStack_258 = (char *)0x1a062c;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a21c3;
            pcStack_258 = (char *)0x1a065e;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a0672;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a0690;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_34,
                                          run_test_idna_toascii::s_34 + 0x38,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x25;
            if (sStack_250 != 0x25) goto LAB_001a21d0;
            pcStack_258 = (char *)0x1a06c0;
            iVar2 = memcmp(acStack_240,"xn--b1abfaaepdrnnbgefbadotcwatmq2g4l",0x25);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a21dd;
            pcStack_258 = (char *)0x1a06eb;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a070b;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x25;
            if (sStack_250 != 0x25) goto LAB_001a21ea;
            pcStack_258 = (char *)0x1a073e;
            iVar2 = memcmp(alStack_140,"xn--b1abfaaepdrnnbgefbadotcwatmq2g4l",0x25);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a21f7;
            pcStack_258 = (char *)0x1a0773;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2204;
            pcStack_258 = (char *)0x1a07a5;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a07b9;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a07d7;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_35,
                                          run_test_idna_toascii::s_35 + 0x2a,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x32;
            if (sStack_250 != 0x32) goto LAB_001a2211;
            pcStack_258 = (char *)0x1a0807;
            iVar2 = memcmp(acStack_240,"xn--PorqunopuedensimplementehablarenEspaol-fmd56a",0x32);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a221e;
            pcStack_258 = (char *)0x1a0832;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a0852;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x32;
            if (sStack_250 != 0x32) goto LAB_001a222b;
            pcStack_258 = (char *)0x1a0885;
            iVar2 = memcmp(alStack_140,"xn--PorqunopuedensimplementehablarenEspaol-fmd56a",0x32);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2238;
            pcStack_258 = (char *)0x1a08ba;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2245;
            pcStack_258 = (char *)0x1a08ec;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a0900;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a091e;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_36,
                                          run_test_idna_toascii::s_36 + 0x2d,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x31;
            if (sStack_250 != 0x31) goto LAB_001a2252;
            pcStack_258 = (char *)0x1a094e;
            iVar2 = memcmp(acStack_240,"xn--TisaohkhngthchnitingVit-kjcr8268qyxafd2f1b9g",0x31);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a225f;
            pcStack_258 = (char *)0x1a0979;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a0999;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x31;
            if (sStack_250 != 0x31) goto LAB_001a226c;
            pcStack_258 = (char *)0x1a09cc;
            iVar2 = memcmp(alStack_140,"xn--TisaohkhngthchnitingVit-kjcr8268qyxafd2f1b9g",0x31);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2279;
            pcStack_258 = (char *)0x1a0a01;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2286;
            pcStack_258 = (char *)0x1a0a33;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a0a47;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a0a65;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_37,
                                          run_test_idna_toascii::s_37 + 0x14,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1d;
            if (sStack_250 != 0x1d) goto LAB_001a2293;
            pcStack_258 = (char *)0x1a0a95;
            iVar2 = memcmp(acStack_240,"xn--3B-ww4c5e180e575a65lsy2b",0x1d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a22a0;
            pcStack_258 = (char *)0x1a0ac0;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a0ae0;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1d;
            if (sStack_250 != 0x1d) goto LAB_001a22ad;
            pcStack_258 = (char *)0x1a0b13;
            iVar2 = memcmp(alStack_140,"xn--3B-ww4c5e180e575a65lsy2b",0x1d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a22ba;
            pcStack_258 = (char *)0x1a0b48;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a22c7;
            pcStack_258 = (char *)0x1a0b7a;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a0b8e;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a0bac;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_38,
                                          run_test_idna_toascii::s_38 + 0x22,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x2d;
            if (sStack_250 != 0x2d) goto LAB_001a22d4;
            pcStack_258 = (char *)0x1a0bdc;
            iVar2 = memcmp(acStack_240,"xn---with-SUPER-MONKEYS-pc58ag80a8qai00g7n9n",0x2d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a22e1;
            pcStack_258 = (char *)0x1a0c07;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a0c27;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x2d;
            if (sStack_250 != 0x2d) goto LAB_001a22ee;
            pcStack_258 = (char *)0x1a0c5a;
            iVar2 = memcmp(alStack_140,"xn---with-SUPER-MONKEYS-pc58ag80a8qai00g7n9n",0x2d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a22fb;
            pcStack_258 = (char *)0x1a0c8f;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2308;
            pcStack_258 = (char *)0x1a0cc1;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a0cd5;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a0cf3;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_39,
                                          run_test_idna_toascii::s_39 + 0x27,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x2d;
            if (sStack_250 != 0x2d) goto LAB_001a2315;
            pcStack_258 = (char *)0x1a0d23;
            iVar2 = memcmp(acStack_240,"xn--Hello-Another-Way--fc4qua05auwb3674vfr0b",0x2d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2322;
            pcStack_258 = (char *)0x1a0d4e;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a0d6e;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x2d;
            if (sStack_250 != 0x2d) goto LAB_001a232f;
            pcStack_258 = (char *)0x1a0da1;
            iVar2 = memcmp(alStack_140,"xn--Hello-Another-Way--fc4qua05auwb3674vfr0b",0x2d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a233c;
            pcStack_258 = (char *)0x1a0dd6;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2349;
            pcStack_258 = (char *)0x1a0e08;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a0e1c;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a0e3a;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_40,
                                          run_test_idna_toascii::s_40 + 0x16,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x18;
            if (sStack_250 != 0x18) goto LAB_001a2356;
            pcStack_258 = (char *)0x1a0e6a;
            iVar2 = memcmp(acStack_240,"xn--2-u9tlzr9756bt3uc0v",0x18);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2363;
            pcStack_258 = (char *)0x1a0e95;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a0eb5;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x18;
            if (sStack_250 != 0x18) goto LAB_001a2370;
            pcStack_258 = (char *)0x1a0ee8;
            iVar2 = memcmp(alStack_140,"xn--2-u9tlzr9756bt3uc0v",0x18);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a237d;
            pcStack_258 = (char *)0x1a0f1d;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a238a;
            pcStack_258 = (char *)0x1a0f4f;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a0f63;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a0f81;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_41,
                                          run_test_idna_toascii::s_41 + 0x17,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1f;
            if (sStack_250 != 0x1f) goto LAB_001a2397;
            pcStack_258 = (char *)0x1a0fb1;
            iVar2 = memcmp(acStack_240,"xn--MajiKoi5-783gue6qz075azm5e",0x1f);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a23a4;
            pcStack_258 = (char *)0x1a0fdc;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a0ffc;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1f;
            if (sStack_250 != 0x1f) goto LAB_001a23b1;
            pcStack_258 = (char *)0x1a102f;
            iVar2 = memcmp(alStack_140,"xn--MajiKoi5-783gue6qz075azm5e",0x1f);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a23be;
            pcStack_258 = (char *)0x1a1064;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a23cb;
            pcStack_258 = (char *)0x1a1096;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a10aa;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a10c8;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_42,
                                          run_test_idna_toascii::s_42 + 0x17,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x16;
            if (sStack_250 != 0x16) goto LAB_001a23d8;
            pcStack_258 = (char *)0x1a10f8;
            iVar2 = memcmp(acStack_240,"xn--de-jg4avhby1noc0d",0x16);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a23e5;
            pcStack_258 = (char *)0x1a1123;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a1143;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x16;
            if (sStack_250 != 0x16) goto LAB_001a23f2;
            pcStack_258 = (char *)0x1a1176;
            iVar2 = memcmp(alStack_140,"xn--de-jg4avhby1noc0d",0x16);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a23ff;
            pcStack_258 = (char *)0x1a11ab;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a240c;
            pcStack_258 = (char *)0x1a11dd;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a11f1;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a120f;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_43,
                                          run_test_idna_toascii::s_43 + 0x15,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x14;
            if (sStack_250 != 0x14) goto LAB_001a2419;
            pcStack_258 = (char *)0x1a123f;
            iVar2 = memcmp(acStack_240,"xn--d9juau41awczczp",0x14);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2426;
            pcStack_258 = (char *)0x1a126a;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a128a;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x14;
            if (sStack_250 != 0x14) goto LAB_001a2433;
            pcStack_258 = (char *)0x1a12bd;
            iVar2 = memcmp(alStack_140,"xn--d9juau41awczczp",0x14);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2440;
            pcStack_258 = (char *)0x1a12f2;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a244d;
            pcStack_258 = (char *)0x1a1324;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a1338;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a1356;
            sStack_250 = uv__idna_toascii("-> $1.00 <-","",acStack_240,(char *)alStack_140);
            uStack_248 = 0xc;
            if (sStack_250 != 0xc) goto LAB_001a245a;
            pcStack_258 = (char *)0x1a1386;
            iVar2 = memcmp(acStack_240,"-> $1.00 <-",0xc);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2467;
            pcStack_258 = (char *)0x1a13b1;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a13d1;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0xc;
            if (sStack_250 != 0xc) goto LAB_001a2474;
            pcStack_258 = (char *)0x1a1404;
            iVar2 = memcmp(alStack_140,"-> $1.00 <-",0xc);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2481;
            pcStack_258 = (char *)0x1a1439;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a248e;
            pcStack_258 = (char *)0x1a146b;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a147f;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a149d;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_45,
                                          run_test_idna_toascii::s_45 + 7,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0xe;
            if (sStack_250 != 0xe) goto LAB_001a249b;
            pcStack_258 = (char *)0x1a14cd;
            iVar2 = memcmp(acStack_240,"xn--fa-hia.de",0xe);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a24a8;
            pcStack_258 = (char *)0x1a14f8;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a1518;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0xe;
            if (sStack_250 != 0xe) goto LAB_001a24b5;
            pcStack_258 = (char *)0x1a154b;
            iVar2 = memcmp(alStack_140,"xn--fa-hia.de",0xe);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a24c2;
            pcStack_258 = (char *)0x1a1580;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a24cf;
            pcStack_258 = (char *)0x1a15b2;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a15c6;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a15e4;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_46,
                                          run_test_idna_toascii::s_46 + 0xe,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a24dc;
            pcStack_258 = (char *)0x1a1614;
            iVar2 = memcmp(acStack_240,"xn--nxasmm1c.com",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a24e9;
            pcStack_258 = (char *)0x1a163f;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a165f;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a24f6;
            pcStack_258 = (char *)0x1a1692;
            iVar2 = memcmp(alStack_140,"xn--nxasmm1c.com",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2503;
            pcStack_258 = (char *)0x1a16c7;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2510;
            pcStack_258 = (char *)0x1a16f9;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a170d;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a172b;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_47,
                                          run_test_idna_toascii::s_47 + 0x13,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x15;
            if (sStack_250 != 0x15) goto LAB_001a251d;
            pcStack_258 = (char *)0x1a175b;
            iVar2 = memcmp(acStack_240,"xn--10cl1a0b660p.com",0x15);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a252a;
            pcStack_258 = (char *)0x1a1786;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a17a6;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x15;
            if (sStack_250 != 0x15) goto LAB_001a2537;
            pcStack_258 = (char *)0x1a17d9;
            iVar2 = memcmp(alStack_140,"xn--10cl1a0b660p.com",0x15);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2544;
            pcStack_258 = (char *)0x1a180e;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2551;
            pcStack_258 = (char *)0x1a1840;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a1854;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a1872;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_48,
                                          run_test_idna_toascii::s_48 + 0x13,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x18;
            if (sStack_250 != 0x18) goto LAB_001a255e;
            pcStack_258 = (char *)0x1a18a2;
            iVar2 = memcmp(acStack_240,"xn--mgba3gch31f060k.com",0x18);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a256b;
            pcStack_258 = (char *)0x1a18cd;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a18ed;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x18;
            if (sStack_250 != 0x18) goto LAB_001a2578;
            pcStack_258 = (char *)0x1a1920;
            iVar2 = memcmp(alStack_140,"xn--mgba3gch31f060k.com",0x18);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a2585;
            pcStack_258 = (char *)0x1a1955;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 == 0) {
              return 0;
            }
          }
          else {
            pcStack_258 = (char *)0x1a198e;
            run_test_idna_toascii_cold_1();
LAB_001a198e:
            pcStack_258 = (char *)0x1a199e;
            run_test_idna_toascii_cold_2();
            pcStack_258 = (char *)0x1a19b0;
            run_test_idna_toascii_cold_3();
LAB_001a19b0:
            pcStack_258 = (char *)0x1a19bd;
            run_test_idna_toascii_cold_4();
LAB_001a19bd:
            pcStack_258 = (char *)0x1a19ca;
            run_test_idna_toascii_cold_5();
LAB_001a19ca:
            pcStack_258 = (char *)0x1a19d7;
            run_test_idna_toascii_cold_6();
LAB_001a19d7:
            pcStack_258 = (char *)0x1a19e4;
            run_test_idna_toascii_cold_7();
LAB_001a19e4:
            pcStack_258 = (char *)0x1a19f1;
            run_test_idna_toascii_cold_8();
LAB_001a19f1:
            pcStack_258 = (char *)0x1a19fe;
            run_test_idna_toascii_cold_9();
LAB_001a19fe:
            pcStack_258 = (char *)0x1a1a0b;
            run_test_idna_toascii_cold_10();
LAB_001a1a0b:
            pcStack_258 = (char *)0x1a1a18;
            run_test_idna_toascii_cold_11();
LAB_001a1a18:
            pcStack_258 = (char *)0x1a1a25;
            run_test_idna_toascii_cold_12();
LAB_001a1a25:
            pcStack_258 = (char *)0x1a1a32;
            run_test_idna_toascii_cold_13();
LAB_001a1a32:
            pcStack_258 = (char *)0x1a1a3f;
            run_test_idna_toascii_cold_14();
LAB_001a1a3f:
            pcStack_258 = (char *)0x1a1a4c;
            run_test_idna_toascii_cold_15();
LAB_001a1a4c:
            pcStack_258 = (char *)0x1a1a59;
            run_test_idna_toascii_cold_16();
LAB_001a1a59:
            pcStack_258 = (char *)0x1a1a66;
            run_test_idna_toascii_cold_17();
LAB_001a1a66:
            pcStack_258 = (char *)0x1a1a73;
            run_test_idna_toascii_cold_18();
LAB_001a1a73:
            pcStack_258 = (char *)0x1a1a80;
            run_test_idna_toascii_cold_19();
LAB_001a1a80:
            pcStack_258 = (char *)0x1a1a8d;
            run_test_idna_toascii_cold_20();
LAB_001a1a8d:
            pcStack_258 = (char *)0x1a1a9a;
            run_test_idna_toascii_cold_21();
LAB_001a1a9a:
            pcStack_258 = (char *)0x1a1aa7;
            run_test_idna_toascii_cold_22();
LAB_001a1aa7:
            pcStack_258 = (char *)0x1a1ab4;
            run_test_idna_toascii_cold_23();
LAB_001a1ab4:
            pcStack_258 = (char *)0x1a1ac1;
            run_test_idna_toascii_cold_24();
LAB_001a1ac1:
            pcStack_258 = (char *)0x1a1ace;
            run_test_idna_toascii_cold_25();
LAB_001a1ace:
            pcStack_258 = (char *)0x1a1adb;
            run_test_idna_toascii_cold_26();
LAB_001a1adb:
            pcStack_258 = (char *)0x1a1ae8;
            run_test_idna_toascii_cold_27();
LAB_001a1ae8:
            pcStack_258 = (char *)0x1a1af5;
            run_test_idna_toascii_cold_28();
LAB_001a1af5:
            pcStack_258 = (char *)0x1a1b02;
            run_test_idna_toascii_cold_29();
LAB_001a1b02:
            pcStack_258 = (char *)0x1a1b0f;
            run_test_idna_toascii_cold_30();
LAB_001a1b0f:
            pcStack_258 = (char *)0x1a1b1c;
            run_test_idna_toascii_cold_31();
LAB_001a1b1c:
            pcStack_258 = (char *)0x1a1b29;
            run_test_idna_toascii_cold_32();
LAB_001a1b29:
            pcStack_258 = (char *)0x1a1b36;
            run_test_idna_toascii_cold_33();
LAB_001a1b36:
            pcStack_258 = (char *)0x1a1b43;
            run_test_idna_toascii_cold_34();
LAB_001a1b43:
            pcStack_258 = (char *)0x1a1b50;
            run_test_idna_toascii_cold_35();
LAB_001a1b50:
            pcStack_258 = (char *)0x1a1b5d;
            run_test_idna_toascii_cold_36();
LAB_001a1b5d:
            pcStack_258 = (char *)0x1a1b6a;
            run_test_idna_toascii_cold_37();
LAB_001a1b6a:
            pcStack_258 = (char *)0x1a1b77;
            run_test_idna_toascii_cold_38();
LAB_001a1b77:
            pcStack_258 = (char *)0x1a1b84;
            run_test_idna_toascii_cold_39();
LAB_001a1b84:
            pcStack_258 = (char *)0x1a1b91;
            run_test_idna_toascii_cold_40();
LAB_001a1b91:
            pcStack_258 = (char *)0x1a1b9e;
            run_test_idna_toascii_cold_41();
LAB_001a1b9e:
            pcStack_258 = (char *)0x1a1bab;
            run_test_idna_toascii_cold_42();
LAB_001a1bab:
            pcStack_258 = (char *)0x1a1bb8;
            run_test_idna_toascii_cold_43();
LAB_001a1bb8:
            pcStack_258 = (char *)0x1a1bc5;
            run_test_idna_toascii_cold_44();
LAB_001a1bc5:
            pcStack_258 = (char *)0x1a1bd2;
            run_test_idna_toascii_cold_45();
LAB_001a1bd2:
            pcStack_258 = (char *)0x1a1bdf;
            run_test_idna_toascii_cold_46();
LAB_001a1bdf:
            pcStack_258 = (char *)0x1a1bec;
            run_test_idna_toascii_cold_47();
LAB_001a1bec:
            pcStack_258 = (char *)0x1a1bf9;
            run_test_idna_toascii_cold_48();
LAB_001a1bf9:
            pcStack_258 = (char *)0x1a1c06;
            run_test_idna_toascii_cold_49();
LAB_001a1c06:
            pcStack_258 = (char *)0x1a1c13;
            run_test_idna_toascii_cold_50();
LAB_001a1c13:
            pcStack_258 = (char *)0x1a1c20;
            run_test_idna_toascii_cold_51();
LAB_001a1c20:
            pcStack_258 = (char *)0x1a1c2d;
            run_test_idna_toascii_cold_52();
LAB_001a1c2d:
            pcStack_258 = (char *)0x1a1c3a;
            run_test_idna_toascii_cold_53();
LAB_001a1c3a:
            pcStack_258 = (char *)0x1a1c47;
            run_test_idna_toascii_cold_54();
LAB_001a1c47:
            pcStack_258 = (char *)0x1a1c54;
            run_test_idna_toascii_cold_55();
LAB_001a1c54:
            pcStack_258 = (char *)0x1a1c61;
            run_test_idna_toascii_cold_56();
LAB_001a1c61:
            pcStack_258 = (char *)0x1a1c6e;
            run_test_idna_toascii_cold_57();
LAB_001a1c6e:
            pcStack_258 = (char *)0x1a1c7b;
            run_test_idna_toascii_cold_58();
LAB_001a1c7b:
            pcStack_258 = (char *)0x1a1c88;
            run_test_idna_toascii_cold_59();
LAB_001a1c88:
            pcStack_258 = (char *)0x1a1c95;
            run_test_idna_toascii_cold_60();
LAB_001a1c95:
            pcStack_258 = (char *)0x1a1ca2;
            run_test_idna_toascii_cold_61();
LAB_001a1ca2:
            pcStack_258 = (char *)0x1a1caf;
            run_test_idna_toascii_cold_62();
LAB_001a1caf:
            pcStack_258 = (char *)0x1a1cbc;
            run_test_idna_toascii_cold_63();
LAB_001a1cbc:
            pcStack_258 = (char *)0x1a1cc9;
            run_test_idna_toascii_cold_64();
LAB_001a1cc9:
            pcStack_258 = (char *)0x1a1cd6;
            run_test_idna_toascii_cold_65();
LAB_001a1cd6:
            pcStack_258 = (char *)0x1a1ce3;
            run_test_idna_toascii_cold_66();
LAB_001a1ce3:
            pcStack_258 = (char *)0x1a1cf0;
            run_test_idna_toascii_cold_67();
LAB_001a1cf0:
            pcStack_258 = (char *)0x1a1cfd;
            run_test_idna_toascii_cold_68();
LAB_001a1cfd:
            pcStack_258 = (char *)0x1a1d0a;
            run_test_idna_toascii_cold_69();
LAB_001a1d0a:
            pcStack_258 = (char *)0x1a1d17;
            run_test_idna_toascii_cold_70();
LAB_001a1d17:
            pcStack_258 = (char *)0x1a1d24;
            run_test_idna_toascii_cold_71();
LAB_001a1d24:
            pcStack_258 = (char *)0x1a1d31;
            run_test_idna_toascii_cold_72();
LAB_001a1d31:
            pcStack_258 = (char *)0x1a1d3e;
            run_test_idna_toascii_cold_73();
LAB_001a1d3e:
            pcStack_258 = (char *)0x1a1d4b;
            run_test_idna_toascii_cold_74();
LAB_001a1d4b:
            pcStack_258 = (char *)0x1a1d58;
            run_test_idna_toascii_cold_75();
LAB_001a1d58:
            pcStack_258 = (char *)0x1a1d65;
            run_test_idna_toascii_cold_76();
LAB_001a1d65:
            pcStack_258 = (char *)0x1a1d72;
            run_test_idna_toascii_cold_77();
LAB_001a1d72:
            pcStack_258 = (char *)0x1a1d7f;
            run_test_idna_toascii_cold_78();
LAB_001a1d7f:
            pcStack_258 = (char *)0x1a1d8c;
            run_test_idna_toascii_cold_79();
LAB_001a1d8c:
            pcStack_258 = (char *)0x1a1d99;
            run_test_idna_toascii_cold_80();
LAB_001a1d99:
            pcStack_258 = (char *)0x1a1da6;
            run_test_idna_toascii_cold_81();
LAB_001a1da6:
            pcStack_258 = (char *)0x1a1db3;
            run_test_idna_toascii_cold_82();
LAB_001a1db3:
            pcStack_258 = (char *)0x1a1dc0;
            run_test_idna_toascii_cold_83();
LAB_001a1dc0:
            pcStack_258 = (char *)0x1a1dcd;
            run_test_idna_toascii_cold_84();
LAB_001a1dcd:
            pcStack_258 = (char *)0x1a1dda;
            run_test_idna_toascii_cold_85();
LAB_001a1dda:
            pcStack_258 = (char *)0x1a1de7;
            run_test_idna_toascii_cold_86();
LAB_001a1de7:
            pcStack_258 = (char *)0x1a1df4;
            run_test_idna_toascii_cold_87();
LAB_001a1df4:
            pcStack_258 = (char *)0x1a1e01;
            run_test_idna_toascii_cold_88();
LAB_001a1e01:
            pcStack_258 = (char *)0x1a1e0e;
            run_test_idna_toascii_cold_89();
LAB_001a1e0e:
            pcStack_258 = (char *)0x1a1e1b;
            run_test_idna_toascii_cold_90();
LAB_001a1e1b:
            pcStack_258 = (char *)0x1a1e28;
            run_test_idna_toascii_cold_91();
LAB_001a1e28:
            pcStack_258 = (char *)0x1a1e35;
            run_test_idna_toascii_cold_92();
LAB_001a1e35:
            pcStack_258 = (char *)0x1a1e42;
            run_test_idna_toascii_cold_93();
LAB_001a1e42:
            pcStack_258 = (char *)0x1a1e4f;
            run_test_idna_toascii_cold_94();
LAB_001a1e4f:
            pcStack_258 = (char *)0x1a1e5c;
            run_test_idna_toascii_cold_95();
LAB_001a1e5c:
            pcStack_258 = (char *)0x1a1e69;
            run_test_idna_toascii_cold_96();
LAB_001a1e69:
            pcStack_258 = (char *)0x1a1e76;
            run_test_idna_toascii_cold_97();
LAB_001a1e76:
            pcStack_258 = (char *)0x1a1e83;
            run_test_idna_toascii_cold_98();
LAB_001a1e83:
            pcStack_258 = (char *)0x1a1e90;
            run_test_idna_toascii_cold_99();
LAB_001a1e90:
            pcStack_258 = (char *)0x1a1e9d;
            run_test_idna_toascii_cold_100();
LAB_001a1e9d:
            pcStack_258 = (char *)0x1a1eaa;
            run_test_idna_toascii_cold_101();
LAB_001a1eaa:
            pcStack_258 = (char *)0x1a1eb7;
            run_test_idna_toascii_cold_102();
LAB_001a1eb7:
            pcStack_258 = (char *)0x1a1ec4;
            run_test_idna_toascii_cold_103();
LAB_001a1ec4:
            pcStack_258 = (char *)0x1a1ed1;
            run_test_idna_toascii_cold_104();
LAB_001a1ed1:
            pcStack_258 = (char *)0x1a1ede;
            run_test_idna_toascii_cold_105();
LAB_001a1ede:
            pcStack_258 = (char *)0x1a1eeb;
            run_test_idna_toascii_cold_106();
LAB_001a1eeb:
            pcStack_258 = (char *)0x1a1ef8;
            run_test_idna_toascii_cold_107();
LAB_001a1ef8:
            pcStack_258 = (char *)0x1a1f05;
            run_test_idna_toascii_cold_108();
LAB_001a1f05:
            pcStack_258 = (char *)0x1a1f12;
            run_test_idna_toascii_cold_109();
LAB_001a1f12:
            pcStack_258 = (char *)0x1a1f1f;
            run_test_idna_toascii_cold_110();
LAB_001a1f1f:
            pcStack_258 = (char *)0x1a1f2c;
            run_test_idna_toascii_cold_111();
LAB_001a1f2c:
            pcStack_258 = (char *)0x1a1f39;
            run_test_idna_toascii_cold_112();
LAB_001a1f39:
            pcStack_258 = (char *)0x1a1f46;
            run_test_idna_toascii_cold_113();
LAB_001a1f46:
            pcStack_258 = (char *)0x1a1f53;
            run_test_idna_toascii_cold_114();
LAB_001a1f53:
            pcStack_258 = (char *)0x1a1f60;
            run_test_idna_toascii_cold_115();
LAB_001a1f60:
            pcStack_258 = (char *)0x1a1f6d;
            run_test_idna_toascii_cold_116();
LAB_001a1f6d:
            pcStack_258 = (char *)0x1a1f7a;
            run_test_idna_toascii_cold_117();
LAB_001a1f7a:
            pcStack_258 = (char *)0x1a1f87;
            run_test_idna_toascii_cold_118();
LAB_001a1f87:
            pcStack_258 = (char *)0x1a1f94;
            run_test_idna_toascii_cold_119();
LAB_001a1f94:
            pcStack_258 = (char *)0x1a1fa1;
            run_test_idna_toascii_cold_120();
LAB_001a1fa1:
            pcStack_258 = (char *)0x1a1fae;
            run_test_idna_toascii_cold_121();
LAB_001a1fae:
            pcStack_258 = (char *)0x1a1fbb;
            run_test_idna_toascii_cold_122();
LAB_001a1fbb:
            pcStack_258 = (char *)0x1a1fc8;
            run_test_idna_toascii_cold_123();
LAB_001a1fc8:
            pcStack_258 = (char *)0x1a1fd5;
            run_test_idna_toascii_cold_124();
LAB_001a1fd5:
            pcStack_258 = (char *)0x1a1fe2;
            run_test_idna_toascii_cold_125();
LAB_001a1fe2:
            pcStack_258 = (char *)0x1a1fef;
            run_test_idna_toascii_cold_126();
LAB_001a1fef:
            pcStack_258 = (char *)0x1a1ffc;
            run_test_idna_toascii_cold_127();
LAB_001a1ffc:
            pcStack_258 = (char *)0x1a2009;
            run_test_idna_toascii_cold_128();
LAB_001a2009:
            pcStack_258 = (char *)0x1a2016;
            run_test_idna_toascii_cold_129();
LAB_001a2016:
            pcStack_258 = (char *)0x1a2023;
            run_test_idna_toascii_cold_130();
LAB_001a2023:
            pcStack_258 = (char *)0x1a2030;
            run_test_idna_toascii_cold_131();
LAB_001a2030:
            pcStack_258 = (char *)0x1a203d;
            run_test_idna_toascii_cold_132();
LAB_001a203d:
            pcStack_258 = (char *)0x1a204a;
            run_test_idna_toascii_cold_133();
LAB_001a204a:
            pcStack_258 = (char *)0x1a2057;
            run_test_idna_toascii_cold_134();
LAB_001a2057:
            pcStack_258 = (char *)0x1a2064;
            run_test_idna_toascii_cold_135();
LAB_001a2064:
            pcStack_258 = (char *)0x1a2071;
            run_test_idna_toascii_cold_136();
LAB_001a2071:
            pcStack_258 = (char *)0x1a207e;
            run_test_idna_toascii_cold_137();
LAB_001a207e:
            pcStack_258 = (char *)0x1a208b;
            run_test_idna_toascii_cold_138();
LAB_001a208b:
            pcStack_258 = (char *)0x1a2098;
            run_test_idna_toascii_cold_139();
LAB_001a2098:
            pcStack_258 = (char *)0x1a20a5;
            run_test_idna_toascii_cold_140();
LAB_001a20a5:
            pcStack_258 = (char *)0x1a20b2;
            run_test_idna_toascii_cold_141();
LAB_001a20b2:
            pcStack_258 = (char *)0x1a20bf;
            run_test_idna_toascii_cold_142();
LAB_001a20bf:
            pcStack_258 = (char *)0x1a20cc;
            run_test_idna_toascii_cold_143();
LAB_001a20cc:
            pcStack_258 = (char *)0x1a20d9;
            run_test_idna_toascii_cold_144();
LAB_001a20d9:
            pcStack_258 = (char *)0x1a20e6;
            run_test_idna_toascii_cold_145();
LAB_001a20e6:
            pcStack_258 = (char *)0x1a20f3;
            run_test_idna_toascii_cold_146();
LAB_001a20f3:
            pcStack_258 = (char *)0x1a2100;
            run_test_idna_toascii_cold_147();
LAB_001a2100:
            pcStack_258 = (char *)0x1a210d;
            run_test_idna_toascii_cold_148();
LAB_001a210d:
            pcStack_258 = (char *)0x1a211a;
            run_test_idna_toascii_cold_149();
LAB_001a211a:
            pcStack_258 = (char *)0x1a2127;
            run_test_idna_toascii_cold_150();
LAB_001a2127:
            pcStack_258 = (char *)0x1a2134;
            run_test_idna_toascii_cold_151();
LAB_001a2134:
            pcStack_258 = (char *)0x1a2141;
            run_test_idna_toascii_cold_152();
LAB_001a2141:
            pcStack_258 = (char *)0x1a214e;
            run_test_idna_toascii_cold_153();
LAB_001a214e:
            pcStack_258 = (char *)0x1a215b;
            run_test_idna_toascii_cold_154();
LAB_001a215b:
            pcStack_258 = (char *)0x1a2168;
            run_test_idna_toascii_cold_155();
LAB_001a2168:
            pcStack_258 = (char *)0x1a2175;
            run_test_idna_toascii_cold_156();
LAB_001a2175:
            pcStack_258 = (char *)0x1a2182;
            run_test_idna_toascii_cold_157();
LAB_001a2182:
            pcStack_258 = (char *)0x1a218f;
            run_test_idna_toascii_cold_158();
LAB_001a218f:
            pcStack_258 = (char *)0x1a219c;
            run_test_idna_toascii_cold_159();
LAB_001a219c:
            pcStack_258 = (char *)0x1a21a9;
            run_test_idna_toascii_cold_160();
LAB_001a21a9:
            pcStack_258 = (char *)0x1a21b6;
            run_test_idna_toascii_cold_161();
LAB_001a21b6:
            pcStack_258 = (char *)0x1a21c3;
            run_test_idna_toascii_cold_162();
LAB_001a21c3:
            pcStack_258 = (char *)0x1a21d0;
            run_test_idna_toascii_cold_163();
LAB_001a21d0:
            pcStack_258 = (char *)0x1a21dd;
            run_test_idna_toascii_cold_164();
LAB_001a21dd:
            pcStack_258 = (char *)0x1a21ea;
            run_test_idna_toascii_cold_165();
LAB_001a21ea:
            pcStack_258 = (char *)0x1a21f7;
            run_test_idna_toascii_cold_166();
LAB_001a21f7:
            pcStack_258 = (char *)0x1a2204;
            run_test_idna_toascii_cold_167();
LAB_001a2204:
            pcStack_258 = (char *)0x1a2211;
            run_test_idna_toascii_cold_168();
LAB_001a2211:
            pcStack_258 = (char *)0x1a221e;
            run_test_idna_toascii_cold_169();
LAB_001a221e:
            pcStack_258 = (char *)0x1a222b;
            run_test_idna_toascii_cold_170();
LAB_001a222b:
            pcStack_258 = (char *)0x1a2238;
            run_test_idna_toascii_cold_171();
LAB_001a2238:
            pcStack_258 = (char *)0x1a2245;
            run_test_idna_toascii_cold_172();
LAB_001a2245:
            pcStack_258 = (char *)0x1a2252;
            run_test_idna_toascii_cold_173();
LAB_001a2252:
            pcStack_258 = (char *)0x1a225f;
            run_test_idna_toascii_cold_174();
LAB_001a225f:
            pcStack_258 = (char *)0x1a226c;
            run_test_idna_toascii_cold_175();
LAB_001a226c:
            pcStack_258 = (char *)0x1a2279;
            run_test_idna_toascii_cold_176();
LAB_001a2279:
            pcStack_258 = (char *)0x1a2286;
            run_test_idna_toascii_cold_177();
LAB_001a2286:
            pcStack_258 = (char *)0x1a2293;
            run_test_idna_toascii_cold_178();
LAB_001a2293:
            pcStack_258 = (char *)0x1a22a0;
            run_test_idna_toascii_cold_179();
LAB_001a22a0:
            pcStack_258 = (char *)0x1a22ad;
            run_test_idna_toascii_cold_180();
LAB_001a22ad:
            pcStack_258 = (char *)0x1a22ba;
            run_test_idna_toascii_cold_181();
LAB_001a22ba:
            pcStack_258 = (char *)0x1a22c7;
            run_test_idna_toascii_cold_182();
LAB_001a22c7:
            pcStack_258 = (char *)0x1a22d4;
            run_test_idna_toascii_cold_183();
LAB_001a22d4:
            pcStack_258 = (char *)0x1a22e1;
            run_test_idna_toascii_cold_184();
LAB_001a22e1:
            pcStack_258 = (char *)0x1a22ee;
            run_test_idna_toascii_cold_185();
LAB_001a22ee:
            pcStack_258 = (char *)0x1a22fb;
            run_test_idna_toascii_cold_186();
LAB_001a22fb:
            pcStack_258 = (char *)0x1a2308;
            run_test_idna_toascii_cold_187();
LAB_001a2308:
            pcStack_258 = (char *)0x1a2315;
            run_test_idna_toascii_cold_188();
LAB_001a2315:
            pcStack_258 = (char *)0x1a2322;
            run_test_idna_toascii_cold_189();
LAB_001a2322:
            pcStack_258 = (char *)0x1a232f;
            run_test_idna_toascii_cold_190();
LAB_001a232f:
            pcStack_258 = (char *)0x1a233c;
            run_test_idna_toascii_cold_191();
LAB_001a233c:
            pcStack_258 = (char *)0x1a2349;
            run_test_idna_toascii_cold_192();
LAB_001a2349:
            pcStack_258 = (char *)0x1a2356;
            run_test_idna_toascii_cold_193();
LAB_001a2356:
            pcStack_258 = (char *)0x1a2363;
            run_test_idna_toascii_cold_194();
LAB_001a2363:
            pcStack_258 = (char *)0x1a2370;
            run_test_idna_toascii_cold_195();
LAB_001a2370:
            pcStack_258 = (char *)0x1a237d;
            run_test_idna_toascii_cold_196();
LAB_001a237d:
            pcStack_258 = (char *)0x1a238a;
            run_test_idna_toascii_cold_197();
LAB_001a238a:
            pcStack_258 = (char *)0x1a2397;
            run_test_idna_toascii_cold_198();
LAB_001a2397:
            pcStack_258 = (char *)0x1a23a4;
            run_test_idna_toascii_cold_199();
LAB_001a23a4:
            pcStack_258 = (char *)0x1a23b1;
            run_test_idna_toascii_cold_200();
LAB_001a23b1:
            pcStack_258 = (char *)0x1a23be;
            run_test_idna_toascii_cold_201();
LAB_001a23be:
            pcStack_258 = (char *)0x1a23cb;
            run_test_idna_toascii_cold_202();
LAB_001a23cb:
            pcStack_258 = (char *)0x1a23d8;
            run_test_idna_toascii_cold_203();
LAB_001a23d8:
            pcStack_258 = (char *)0x1a23e5;
            run_test_idna_toascii_cold_204();
LAB_001a23e5:
            pcStack_258 = (char *)0x1a23f2;
            run_test_idna_toascii_cold_205();
LAB_001a23f2:
            pcStack_258 = (char *)0x1a23ff;
            run_test_idna_toascii_cold_206();
LAB_001a23ff:
            pcStack_258 = (char *)0x1a240c;
            run_test_idna_toascii_cold_207();
LAB_001a240c:
            pcStack_258 = (char *)0x1a2419;
            run_test_idna_toascii_cold_208();
LAB_001a2419:
            pcStack_258 = (char *)0x1a2426;
            run_test_idna_toascii_cold_209();
LAB_001a2426:
            pcStack_258 = (char *)0x1a2433;
            run_test_idna_toascii_cold_210();
LAB_001a2433:
            pcStack_258 = (char *)0x1a2440;
            run_test_idna_toascii_cold_211();
LAB_001a2440:
            pcStack_258 = (char *)0x1a244d;
            run_test_idna_toascii_cold_212();
LAB_001a244d:
            pcStack_258 = (char *)0x1a245a;
            run_test_idna_toascii_cold_213();
LAB_001a245a:
            pcStack_258 = (char *)0x1a2467;
            run_test_idna_toascii_cold_214();
LAB_001a2467:
            pcStack_258 = (char *)0x1a2474;
            run_test_idna_toascii_cold_215();
LAB_001a2474:
            pcStack_258 = (char *)0x1a2481;
            run_test_idna_toascii_cold_216();
LAB_001a2481:
            pcStack_258 = (char *)0x1a248e;
            run_test_idna_toascii_cold_217();
LAB_001a248e:
            pcStack_258 = (char *)0x1a249b;
            run_test_idna_toascii_cold_218();
LAB_001a249b:
            pcStack_258 = (char *)0x1a24a8;
            run_test_idna_toascii_cold_219();
LAB_001a24a8:
            pcStack_258 = (char *)0x1a24b5;
            run_test_idna_toascii_cold_220();
LAB_001a24b5:
            pcStack_258 = (char *)0x1a24c2;
            run_test_idna_toascii_cold_221();
LAB_001a24c2:
            pcStack_258 = (char *)0x1a24cf;
            run_test_idna_toascii_cold_222();
LAB_001a24cf:
            pcStack_258 = (char *)0x1a24dc;
            run_test_idna_toascii_cold_223();
LAB_001a24dc:
            pcStack_258 = (char *)0x1a24e9;
            run_test_idna_toascii_cold_224();
LAB_001a24e9:
            pcStack_258 = (char *)0x1a24f6;
            run_test_idna_toascii_cold_225();
LAB_001a24f6:
            pcStack_258 = (char *)0x1a2503;
            run_test_idna_toascii_cold_226();
LAB_001a2503:
            pcStack_258 = (char *)0x1a2510;
            run_test_idna_toascii_cold_227();
LAB_001a2510:
            pcStack_258 = (char *)0x1a251d;
            run_test_idna_toascii_cold_228();
LAB_001a251d:
            pcStack_258 = (char *)0x1a252a;
            run_test_idna_toascii_cold_229();
LAB_001a252a:
            pcStack_258 = (char *)0x1a2537;
            run_test_idna_toascii_cold_230();
LAB_001a2537:
            pcStack_258 = (char *)0x1a2544;
            run_test_idna_toascii_cold_231();
LAB_001a2544:
            pcStack_258 = (char *)0x1a2551;
            run_test_idna_toascii_cold_232();
LAB_001a2551:
            pcStack_258 = (char *)0x1a255e;
            run_test_idna_toascii_cold_233();
LAB_001a255e:
            pcStack_258 = (char *)0x1a256b;
            run_test_idna_toascii_cold_234();
LAB_001a256b:
            pcStack_258 = (char *)0x1a2578;
            run_test_idna_toascii_cold_235();
LAB_001a2578:
            pcStack_258 = (char *)0x1a2585;
            run_test_idna_toascii_cold_236();
LAB_001a2585:
            pcStack_258 = (char *)0x1a2592;
            run_test_idna_toascii_cold_237();
          }
          pcStack_258 = (char *)0x1a259f;
          run_test_idna_toascii_cold_238();
          pcStack_258 = acStack_240;
          puVar4 = uv_default_loop();
          iVar2 = uv_pipe_init(puVar4,&p1,0);
          uStack_260 = (long)iVar2;
          if (uStack_260 == 0) {
            iVar2 = uv_pipe_init(puVar4,&p2,0);
            uStack_260 = (long)iVar2;
            if (uStack_260 != 0) goto LAB_001a27f4;
            iVar2 = uv_idle_init(puVar4,&idle_handle);
            uStack_260 = (long)iVar2;
            if (uStack_260 != 0) goto LAB_001a2803;
            iVar2 = pipe((int *)&uStack_260);
            if (iVar2 != 0) goto LAB_001a2812;
            iVar2 = pipe(newpipefds);
            if (iVar2 != 0) goto LAB_001a2821;
            iVar2 = uv_pipe_open(&p1,(uv_os_fd_t)uStack_260);
            if (iVar2 != 0) goto LAB_001a2830;
            duped_fd = dup((uv_os_fd_t)uStack_260);
            if (duped_fd == -1) goto LAB_001a283f;
            iVar2 = uv_read_start((uv_stream_t *)&p1,alloc_buffer,read_data);
            if (iVar2 != 0) goto LAB_001a284e;
            iVar2 = close(uStack_260._4_4_);
            if (iVar2 != 0) goto LAB_001a285d;
            uStack_260 = CONCAT44(0xffffffff,(uv_os_fd_t)uStack_260);
            iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
            if (iVar2 == 0) {
              puVar4 = uv_default_loop();
              uv_walk(puVar4,close_walk_cb,(void *)0x0);
              uv_run(puVar4,UV_RUN_DEFAULT);
              puVar4 = uv_default_loop();
              iVar2 = uv_loop_close(puVar4);
              if (iVar2 == 0) {
                uv_library_shutdown();
                return 0;
              }
              goto LAB_001a287b;
            }
          }
          else {
            run_test_iouring_pollhup_cold_1();
LAB_001a27f4:
            run_test_iouring_pollhup_cold_2();
LAB_001a2803:
            run_test_iouring_pollhup_cold_3();
LAB_001a2812:
            run_test_iouring_pollhup_cold_4();
LAB_001a2821:
            run_test_iouring_pollhup_cold_5();
LAB_001a2830:
            run_test_iouring_pollhup_cold_6();
LAB_001a283f:
            run_test_iouring_pollhup_cold_11();
LAB_001a284e:
            run_test_iouring_pollhup_cold_7();
LAB_001a285d:
            run_test_iouring_pollhup_cold_8();
          }
          run_test_iouring_pollhup_cold_9();
LAB_001a287b:
          run_test_iouring_pollhup_cold_10();
          uVar6 = uv_buf_init(alloc_buffer::slab,0x20);
          *extraout_RDX = uVar6;
          return (int)uVar6.base;
        }
      }
      else {
        apcStack_40[0] = (code *)0x19dc2c;
        run_test_utf8_decode1_overrun_cold_2();
      }
      uVar5 = 0x73;
      goto LAB_0019dc5e;
    }
  }
  else {
    apcStack_40[0] = (code *)0x19dbe9;
    run_test_utf8_decode1_overrun_cold_1();
  }
  uVar5 = 0x6d;
LAB_0019dc5e:
  pcStack_48 = "==";
  pcStack_58 = "b + 1";
  uStack_60 = 0x19dc6c;
  pcStack_50 = in_R10;
  apcStack_40[0] = (code *)c;
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-idna.c"
          ,uVar5,"p");
  apcStack_40[0] = (code *)0x19dc75;
  abort();
}

Assistant:

TEST_IMPL(utf8_decode1_overrun) {
  const char* p;
  char b[1];
  char c[1];

  /* Single byte. */
  p = b;
  b[0] = 0x7F;
  ASSERT_EQ(0x7F, uv__utf8_decode1(&p, b + 1));
  ASSERT_PTR_EQ(p, b + 1);

  /* Multi-byte. */
  p = b;
  b[0] = 0xC0;
  ASSERT_EQ((unsigned) -1, uv__utf8_decode1(&p, b + 1));
  ASSERT_PTR_EQ(p, b + 1);

  b[0] = 0x7F;
  ASSERT_EQ(UV_EINVAL, uv__idna_toascii(b, b + 0, c, c + 1));
  ASSERT_EQ(UV_EINVAL, uv__idna_toascii(b, b + 1, c, c + 1));

  return 0;
}